

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void M_StartControlPanel(bool makeSound)

{
  float volume;
  FSoundID local_14;
  int local_10;
  byte local_9;
  int i;
  bool makeSound_local;
  
  if (DMenu::CurrentMenu == (DMenu *)0x0) {
    local_9 = makeSound;
    ResetButtonStates();
    for (local_10 = 0; local_10 < 9; local_10 = local_10 + 1) {
      FButtonStatus::ReleaseKey(MenuButtons + local_10,0);
    }
    C_HideConsole();
    menuactive = MENU_On;
    P_CheckTickerPaused();
    if ((local_9 & 1) != 0) {
      FSoundID::FSoundID(&local_14,"menu/activate");
      volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_14,volume,0.0);
    }
    BackbuttonTime = 0;
    BackbuttonAlpha = 0.0;
  }
  return;
}

Assistant:

void M_StartControlPanel (bool makeSound)
{
	// intro might call this repeatedly
	if (DMenu::CurrentMenu != NULL)
		return;

	ResetButtonStates ();
	for (int i = 0; i < NUM_MKEYS; ++i)
	{
		MenuButtons[i].ReleaseKey(0);
	}

	C_HideConsole ();				// [RH] Make sure console goes bye bye.
	menuactive = MENU_On;
	// Pause sound effects before we play the menu switch sound.
	// That way, it won't be paused.
	P_CheckTickerPaused ();

	if (makeSound)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	}
	BackbuttonTime = 0;
	BackbuttonAlpha = 0;
}